

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O0

void __thiscall
aalcalc::loadoccurrence<occurrence_granular>(aalcalc *this,occurrence_granular *occ,FILE *fin)

{
  mapped_type *this_00;
  size_t local_28;
  size_t i;
  FILE *fin_local;
  occurrence_granular *occ_local;
  aalcalc *this_local;
  
  fread(&this->no_of_periods_,4,1,(FILE *)fin);
  local_28 = fread(occ,0x10,1,(FILE *)fin);
  while (local_28 != 0) {
    this_00 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->event_to_period_,&occ->event_id);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,&occ->period_no);
    if (this->max_period_no_ < occ->period_no) {
      this->max_period_no_ = occ->period_no;
    }
    local_28 = fread(occ,0x10,1,(FILE *)fin);
  }
  if (this->no_of_periods_ < this->max_period_no_) {
    fprintf(_stderr,"FATAL: Period numbers are not contigious\n");
    exit(-1);
  }
  fclose((FILE *)fin);
  return;
}

Assistant:

void aalcalc::loadoccurrence(T &occ, FILE * fin)
{

	size_t i = fread(&no_of_periods_, sizeof(no_of_periods_), 1, fin);
	i = fread(&occ, sizeof(occ), 1, fin);
	while (i != 0) {
		event_to_period_[occ.event_id].push_back(occ.period_no);
		if (max_period_no_ < occ.period_no) max_period_no_ = occ.period_no;
		i = fread(&occ, sizeof(occ), 1, fin);
	}
	
	if (max_period_no_ > no_of_periods_) {
		fprintf(stderr, "FATAL: Period numbers are not contigious\n");
		exit(-1);
	}
	fclose(fin);

}